

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_unmap_mesh.cpp
# Opt level: O1

void Omega_h::unmap_parents
               (Mesh *old_mesh,Mesh *new_mesh,LOs *new_ents2old_ents_a,
               Few<Omega_h::Read<int>,_4> *old_ents2new_ents)

{
  Alloc *pAVar1;
  int *piVar2;
  Alloc *pAVar3;
  byte bVar4;
  int iVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  void *pvVar10;
  uint uVar11;
  ulong **__dest;
  long *plVar12;
  long lVar13;
  ulong *puVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  LO size_in;
  size_t sVar18;
  ScopedTimer omega_h_scoped_function_timer;
  LOs new_ents2old_ents;
  Write<signed_char> new_parent_code;
  Write<int> new_parent_idx;
  type functor;
  Parents old_parents;
  ScopedTimer local_289;
  ulong *local_288;
  long local_280;
  ulong local_278 [2];
  ulong local_268;
  Alloc *local_260;
  void *local_258;
  Write<signed_char> local_250;
  Write<int> local_240;
  ulong *local_230;
  long local_228;
  ulong local_220;
  long lStack_218;
  Mesh *local_210;
  Write<signed_char> local_208;
  Write<int> local_1f8;
  ulong **local_1e8;
  ulong *local_1e0;
  ulong *local_1d8 [2];
  undefined1 local_1c8 [32];
  Alloc *local_1a8;
  void *local_1a0;
  Alloc *local_198;
  void *local_190;
  ulong auStack_188 [8];
  Alloc *local_148;
  void *local_140;
  Alloc *local_138;
  void *pvStack_130;
  Alloc *local_128;
  void *pvStack_120;
  Alloc *local_118;
  void *pvStack_110;
  Alloc *local_108;
  void *pvStack_100;
  ulong local_f8 [8];
  Alloc *local_b8;
  void *pvStack_b0;
  LOs *local_a0;
  Mesh *local_98;
  Parents local_90;
  Read<signed_char> local_70;
  Read<signed_char> local_60;
  Parents local_50;
  
  uVar11 = new_mesh->dim_;
  local_210 = new_mesh;
  local_98 = old_mesh;
  if (uVar11 < 4) {
    pAVar3 = (Alloc *)(local_1c8 + 0x10);
    uVar15 = 1;
    local_a0 = new_ents2old_ents_a;
    do {
      if (uVar11 < uVar15) {
        return;
      }
      local_260 = new_ents2old_ents_a[uVar15].write_.shared_alloc_.alloc;
      if (((ulong)local_260 & 7) == 0 && local_260 != (Alloc *)0x0) {
        if (entering_parallel == 1) {
          local_260 = (Alloc *)(local_260->size * 8 + 1);
        }
        else {
          local_260->use_count = local_260->use_count + 1;
        }
      }
      local_258 = new_ents2old_ents_a[uVar15].write_.shared_alloc_.direct_ptr;
      if (((ulong)local_260 & 1) == 0) {
        sVar18 = local_260->size;
      }
      else {
        sVar18 = (ulong)local_260 >> 3;
      }
      local_268 = uVar15;
      local_1c8._0_8_ = pAVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"parent idx","");
      size_in = (LO)(sVar18 >> 2);
      Write<int>::Write(&local_240,size_in,-1,(string *)local_1c8);
      if ((Alloc *)local_1c8._0_8_ != pAVar3) {
        operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
      }
      local_1c8._0_8_ = pAVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"parent code","");
      Write<signed_char>::Write(&local_250,size_in,'\0',(string *)local_1c8);
      if ((Alloc *)local_1c8._0_8_ != pAVar3) {
        operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
      }
      Mesh::ask_parents(&local_90,local_98,(Int)local_268);
      local_138 = local_260;
      if (((ulong)local_260 & 7) == 0 && local_260 != (Alloc *)0x0) {
        if (entering_parallel == 1) {
          local_138 = (Alloc *)(local_260->size * 8 + 1);
        }
        else {
          local_260->use_count = local_260->use_count + 1;
        }
      }
      pvStack_130 = local_258;
      local_128 = local_90.parent_idx.write_.shared_alloc_.alloc;
      if (((ulong)local_90.parent_idx.write_.shared_alloc_.alloc & 7) == 0 &&
          local_90.parent_idx.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == 1) {
          local_128 = (Alloc *)((local_90.parent_idx.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_90.parent_idx.write_.shared_alloc_.alloc)->use_count =
               (local_90.parent_idx.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      pvStack_120 = local_90.parent_idx.write_.shared_alloc_.direct_ptr;
      local_118 = local_90.codes.write_.shared_alloc_.alloc;
      if (((ulong)local_90.codes.write_.shared_alloc_.alloc & 7) == 0 &&
          local_90.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == 1) {
          local_118 = (Alloc *)((local_90.codes.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_90.codes.write_.shared_alloc_.alloc)->use_count =
               (local_90.codes.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      pvStack_110 = local_90.codes.write_.shared_alloc_.direct_ptr;
      local_108 = local_240.shared_alloc_.alloc;
      if (((ulong)local_240.shared_alloc_.alloc & 7) == 0 &&
          local_240.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == 1) {
          local_108 = (Alloc *)((local_240.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_240.shared_alloc_.alloc)->use_count =
               (local_240.shared_alloc_.alloc)->use_count + 1;
        }
      }
      bVar4 = entering_parallel;
      pvStack_100 = local_240.shared_alloc_.direct_ptr;
      lVar13 = 0x48;
      do {
        plVar12 = *(long **)((long)old_ents2new_ents->array_ + lVar13 + -0x48);
        *(long **)((long)&local_140 + lVar13) = plVar12;
        if (((ulong)plVar12 & 7) == 0 && plVar12 != (long *)0x0) {
          if ((bVar4 & 1) == 0) {
            *(int *)(plVar12 + 6) = (int)plVar12[6] + 1;
          }
          else {
            *(long *)((long)&local_140 + lVar13) = *plVar12 * 8 + 1;
          }
        }
        *(undefined8 *)((long)&local_138 + lVar13) =
             *(undefined8 *)
              ((long)&old_ents2new_ents[-1].array_[0].write_.shared_alloc_.alloc + lVar13);
        lVar13 = lVar13 + 0x10;
      } while (lVar13 != 0x88);
      local_b8 = local_250.shared_alloc_.alloc;
      if (((ulong)local_250.shared_alloc_.alloc & 7) == 0 &&
          local_250.shared_alloc_.alloc != (Alloc *)0x0) {
        if ((bVar4 & 1) == 0) {
          (local_250.shared_alloc_.alloc)->use_count =
               (local_250.shared_alloc_.alloc)->use_count + 1;
        }
        else {
          local_b8 = (Alloc *)((local_250.shared_alloc_.alloc)->size * 8 + 1);
        }
      }
      pvStack_b0 = local_250.shared_alloc_.direct_ptr;
      local_1e8 = local_1d8;
      local_288 = (ulong *)0x5d;
      __dest = (ulong **)std::__cxx11::string::_M_create((ulong *)&local_1e8,(ulong)&local_288);
      puVar14 = local_288;
      local_1d8[0] = local_288;
      local_1e8 = __dest;
      memcpy(__dest,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_for.hpp"
             ,0x5d);
      local_1e0 = puVar14;
      *(undefined1 *)((long)__dest + (long)puVar14) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_1e8);
      puVar14 = (ulong *)(plVar12 + 2);
      if ((ulong *)*plVar12 == puVar14) {
        local_220 = *puVar14;
        lStack_218 = plVar12[3];
        local_230 = &local_220;
      }
      else {
        local_220 = *puVar14;
        local_230 = (ulong *)*plVar12;
      }
      local_228 = plVar12[1];
      *plVar12 = (long)puVar14;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      local_288 = local_278;
      std::__cxx11::string::_M_construct((ulong)&local_288,'\x02');
      *(undefined2 *)local_288 = 0x3438;
      uVar15 = 0xf;
      if (local_230 != &local_220) {
        uVar15 = local_220;
      }
      if (uVar15 < (ulong)(local_280 + local_228)) {
        uVar15 = 0xf;
        if (local_288 != local_278) {
          uVar15 = local_278[0];
        }
        if (uVar15 < (ulong)(local_280 + local_228)) goto LAB_00419030;
        plVar12 = (long *)std::__cxx11::string::replace
                                    ((ulong)&local_288,0,(char *)0x0,(ulong)local_230);
      }
      else {
LAB_00419030:
        plVar12 = (long *)std::__cxx11::string::_M_append((char *)&local_230,(ulong)local_288);
      }
      pAVar1 = (Alloc *)(plVar12 + 2);
      if ((Alloc *)*plVar12 == pAVar1) {
        local_1c8._16_8_ = pAVar1->size;
        local_1c8._24_8_ = plVar12[3];
        local_1c8._0_8_ = pAVar3;
      }
      else {
        local_1c8._16_8_ = pAVar1->size;
        local_1c8._0_8_ = (Alloc *)*plVar12;
      }
      local_1c8._8_8_ = plVar12[1];
      *plVar12 = (long)pAVar1;
      plVar12[1] = 0;
      *(undefined1 *)&pAVar1->size = 0;
      begin_code("parallel_for",(char *)local_1c8._0_8_);
      if ((Alloc *)local_1c8._0_8_ != pAVar3) {
        operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
      }
      new_ents2old_ents_a = local_a0;
      if (local_288 != local_278) {
        operator_delete(local_288,local_278[0] + 1);
      }
      if (local_230 != &local_220) {
        operator_delete(local_230,local_220 + 1);
      }
      if (local_1e8 != local_1d8) {
        operator_delete(local_1e8,(long)local_1d8[0] + 1);
      }
      pvVar10 = pvStack_b0;
      pvVar9 = pvStack_100;
      pvVar8 = pvStack_110;
      pvVar7 = pvStack_120;
      pvVar6 = pvStack_130;
      if (0 < size_in) {
        local_1c8._0_8_ = local_138;
        local_1c8._8_8_ = pvStack_130;
        if (((ulong)local_138 & 7) == 0 && local_138 != (Alloc *)0x0) {
          local_138->use_count = local_138->use_count + -1;
          local_1c8._0_8_ = local_138->size * 8 + 1;
        }
        local_138 = (Alloc *)0x0;
        pvStack_130 = (void *)0x0;
        local_1c8._16_8_ = local_128;
        local_1c8._24_8_ = pvStack_120;
        if (((ulong)local_128 & 7) == 0 && local_128 != (Alloc *)0x0) {
          local_128->use_count = local_128->use_count + -1;
          local_1c8._16_8_ = local_128->size * 8 + 1;
        }
        local_128 = (Alloc *)0x0;
        pvStack_120 = (void *)0x0;
        local_1a8 = local_118;
        local_1a0 = pvStack_110;
        if (((ulong)local_118 & 7) == 0 && local_118 != (Alloc *)0x0) {
          local_118->use_count = local_118->use_count + -1;
          local_1a8 = (Alloc *)(local_118->size * 8 + 1);
        }
        local_118 = (Alloc *)0x0;
        pvStack_110 = (void *)0x0;
        local_198 = local_108;
        local_190 = pvStack_100;
        if (((ulong)local_108 & 7) == 0 && local_108 != (Alloc *)0x0) {
          local_108->use_count = local_108->use_count + -1;
          local_198 = (Alloc *)(local_108->size * 8 + 1);
        }
        local_108 = (Alloc *)0x0;
        pvStack_100 = (void *)0x0;
        lVar13 = 0x40;
        do {
          plVar12 = *(long **)((long)&local_138 + lVar13);
          *(long **)(local_1c8 + lVar13) = plVar12;
          *(undefined8 *)(local_1c8 + lVar13 + 8) = *(undefined8 *)((long)&pvStack_130 + lVar13);
          if (((ulong)plVar12 & 7) == 0 && plVar12 != (long *)0x0) {
            *(int *)(plVar12 + 6) = (int)plVar12[6] + -1;
            *(long *)(local_1c8 + lVar13) = *plVar12 * 8 + 1;
          }
          *(undefined8 *)((long)&local_138 + lVar13) = 0;
          *(undefined8 *)((long)&pvStack_130 + lVar13) = 0;
          lVar13 = lVar13 + 0x10;
        } while (lVar13 != 0x80);
        local_148 = local_b8;
        local_140 = pvStack_b0;
        if (((ulong)local_b8 & 7) == 0 && local_b8 != (Alloc *)0x0) {
          local_b8->use_count = local_b8->use_count + -1;
          local_148 = (Alloc *)(local_b8->size * 8 + 1);
        }
        local_b8 = (Alloc *)0x0;
        pvStack_b0 = (void *)0x0;
        entering_parallel = 0;
        lVar13 = 0;
        do {
          lVar16 = (long)*(int *)((long)pvVar6 + lVar13 * 4);
          lVar17 = (long)*(int *)((long)pvVar7 + lVar16 * 4);
          if (-1 < lVar17) {
            bVar4 = *(byte *)((long)pvVar8 + lVar16);
            iVar5 = *(int *)(*(long *)((long)auStack_188 + (ulong)((bVar4 & 3) << 4) + 8) +
                            lVar17 * 4);
            *(int *)((long)pvVar9 + lVar13 * 4) = iVar5;
            if (-1 < iVar5) {
              *(byte *)((long)pvVar10 + lVar13) = bVar4;
            }
          }
          lVar13 = lVar13 + 1;
        } while (size_in != (int)lVar13);
        unmap_parents(Omega_h::Mesh*,Omega_h::Mesh*,Omega_h::Read<int>*,Omega_h::Few<Omega_h::Read<int>,4>)
        ::$_0::~__0((__0 *)local_1c8);
      }
      ScopedTimer::~ScopedTimer(&local_289);
      local_1f8.shared_alloc_.alloc = local_240.shared_alloc_.alloc;
      if (((ulong)local_240.shared_alloc_.alloc & 7) == 0 &&
          local_240.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == 1) {
          local_1f8.shared_alloc_.alloc = (Alloc *)((local_240.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_240.shared_alloc_.alloc)->use_count =
               (local_240.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_1f8.shared_alloc_.direct_ptr = local_240.shared_alloc_.direct_ptr;
      Read<int>::Read(&local_60,&local_1f8);
      local_208.shared_alloc_.alloc = local_250.shared_alloc_.alloc;
      if (((ulong)local_250.shared_alloc_.alloc & 7) == 0 &&
          local_250.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == 1) {
          local_208.shared_alloc_.alloc = (Alloc *)((local_250.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_250.shared_alloc_.alloc)->use_count =
               (local_250.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_208.shared_alloc_.direct_ptr = local_250.shared_alloc_.direct_ptr;
      Read<signed_char>::Read(&local_70,&local_208);
      Parents::Parents(&local_50,(LOs *)&local_60,&local_70);
      Mesh::set_parents(local_210,(Int)local_268,&local_50);
      pAVar1 = local_50.codes.write_.shared_alloc_.alloc;
      if (((ulong)local_50.codes.write_.shared_alloc_.alloc & 7) == 0 &&
          local_50.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar2 = &(local_50.codes.write_.shared_alloc_.alloc)->use_count;
        *piVar2 = *piVar2 + -1;
        if (*piVar2 == 0) {
          Alloc::~Alloc(local_50.codes.write_.shared_alloc_.alloc);
          operator_delete(pAVar1,0x48);
        }
      }
      pAVar1 = local_50.parent_idx.write_.shared_alloc_.alloc;
      if (((ulong)local_50.parent_idx.write_.shared_alloc_.alloc & 7) == 0 &&
          local_50.parent_idx.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar2 = &(local_50.parent_idx.write_.shared_alloc_.alloc)->use_count;
        *piVar2 = *piVar2 + -1;
        if (*piVar2 == 0) {
          Alloc::~Alloc(local_50.parent_idx.write_.shared_alloc_.alloc);
          operator_delete(pAVar1,0x48);
        }
      }
      pAVar1 = local_70.write_.shared_alloc_.alloc;
      if (((ulong)local_70.write_.shared_alloc_.alloc & 7) == 0 &&
          local_70.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar2 = &(local_70.write_.shared_alloc_.alloc)->use_count;
        *piVar2 = *piVar2 + -1;
        if (*piVar2 == 0) {
          Alloc::~Alloc(local_70.write_.shared_alloc_.alloc);
          operator_delete(pAVar1,0x48);
        }
      }
      pAVar1 = local_208.shared_alloc_.alloc;
      if (((ulong)local_208.shared_alloc_.alloc & 7) == 0 &&
          local_208.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar2 = &(local_208.shared_alloc_.alloc)->use_count;
        *piVar2 = *piVar2 + -1;
        if (*piVar2 == 0) {
          Alloc::~Alloc(local_208.shared_alloc_.alloc);
          operator_delete(pAVar1,0x48);
        }
      }
      pAVar1 = local_60.write_.shared_alloc_.alloc;
      if (((ulong)local_60.write_.shared_alloc_.alloc & 7) == 0 &&
          local_60.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar2 = &(local_60.write_.shared_alloc_.alloc)->use_count;
        *piVar2 = *piVar2 + -1;
        if (*piVar2 == 0) {
          Alloc::~Alloc(local_60.write_.shared_alloc_.alloc);
          operator_delete(pAVar1,0x48);
        }
      }
      pAVar1 = local_1f8.shared_alloc_.alloc;
      if (((ulong)local_1f8.shared_alloc_.alloc & 7) == 0 &&
          local_1f8.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar2 = &(local_1f8.shared_alloc_.alloc)->use_count;
        *piVar2 = *piVar2 + -1;
        if (*piVar2 == 0) {
          Alloc::~Alloc(local_1f8.shared_alloc_.alloc);
          operator_delete(pAVar1,0x48);
        }
      }
      unmap_parents(Omega_h::Mesh*,Omega_h::Mesh*,Omega_h::Read<int>*,Omega_h::Few<Omega_h::Read<int>,4>)
      ::$_0::~__0((__0 *)&local_138);
      pAVar1 = local_90.codes.write_.shared_alloc_.alloc;
      if (((ulong)local_90.codes.write_.shared_alloc_.alloc & 7) == 0 &&
          local_90.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar2 = &(local_90.codes.write_.shared_alloc_.alloc)->use_count;
        *piVar2 = *piVar2 + -1;
        if (*piVar2 == 0) {
          Alloc::~Alloc(local_90.codes.write_.shared_alloc_.alloc);
          operator_delete(pAVar1,0x48);
        }
      }
      pAVar1 = local_90.parent_idx.write_.shared_alloc_.alloc;
      if (((ulong)local_90.parent_idx.write_.shared_alloc_.alloc & 7) == 0 &&
          local_90.parent_idx.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar2 = &(local_90.parent_idx.write_.shared_alloc_.alloc)->use_count;
        *piVar2 = *piVar2 + -1;
        if (*piVar2 == 0) {
          Alloc::~Alloc(local_90.parent_idx.write_.shared_alloc_.alloc);
          operator_delete(pAVar1,0x48);
        }
      }
      pAVar1 = local_250.shared_alloc_.alloc;
      if (((ulong)local_250.shared_alloc_.alloc & 7) == 0 &&
          local_250.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar2 = &(local_250.shared_alloc_.alloc)->use_count;
        *piVar2 = *piVar2 + -1;
        if (*piVar2 == 0) {
          Alloc::~Alloc(local_250.shared_alloc_.alloc);
          operator_delete(pAVar1,0x48);
        }
      }
      pAVar1 = local_240.shared_alloc_.alloc;
      if (((ulong)local_240.shared_alloc_.alloc & 7) == 0 &&
          local_240.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar2 = &(local_240.shared_alloc_.alloc)->use_count;
        *piVar2 = *piVar2 + -1;
        if (*piVar2 == 0) {
          Alloc::~Alloc(local_240.shared_alloc_.alloc);
          operator_delete(pAVar1,0x48);
        }
      }
      pAVar1 = local_260;
      if (((ulong)local_260 & 7) == 0 && local_260 != (Alloc *)0x0) {
        piVar2 = &local_260->use_count;
        *piVar2 = *piVar2 + -1;
        if (*piVar2 == 0) {
          Alloc::~Alloc(local_260);
          operator_delete(pAVar1,0x48);
        }
      }
      uVar15 = local_268 + 1;
      uVar11 = local_210->dim_;
    } while (uVar11 < 4);
  }
  fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
       ,0x33);
}

Assistant:

void unmap_parents(Mesh* old_mesh, Mesh* new_mesh,
    LOs new_ents2old_ents_a[], Few<LOs, 4> old_ents2new_ents) {
  for (Int ent_dim = 1; ent_dim <= new_mesh->dim(); ++ent_dim) {
    auto new_ents2old_ents = new_ents2old_ents_a[ent_dim];
    auto nnew_ents = new_ents2old_ents.size();
    Write<LO> new_parent_idx(nnew_ents, -1, "parent idx");
    Write<Byte> new_parent_code(nnew_ents, 0, "parent code");
    auto old_parents = old_mesh->ask_parents(ent_dim);
    auto functor = OMEGA_H_LAMBDA(LO new_ent) {
      auto old_ent = new_ents2old_ents[new_ent];
      auto old_parent_idx = old_parents.parent_idx[old_ent];
      auto old_parent_code = old_parents.codes[old_ent];
      if (old_parent_idx > -1) {
        auto old_parent_dim = amr::code_parent_dim(old_parent_code);
        new_parent_idx[new_ent] =
          old_ents2new_ents[old_parent_dim][old_parent_idx];
        if (new_parent_idx[new_ent] > -1)
          new_parent_code[new_ent] = old_parent_code;
      }
    };
    parallel_for(nnew_ents, std::move(functor));
    new_mesh->set_parents(ent_dim, Parents{new_parent_idx, new_parent_code});
  }
}